

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhandler.cc
# Opt level: O2

int __thiscall BitDhtHandler::PeerCallback(BitDhtHandler *this,bdId *id,uint32_t status)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  iterator iVar4;
  char *pcVar5;
  
  std::operator<<((ostream *)&std::cerr,"BitDhtHandler::PeerCallback() NodeId: ");
  bdStdPrintId((ostream *)&std::cerr,id);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  pthread_mutex_lock((pthread_mutex_t *)&this->resultsMtx);
  iVar4 = std::
          _Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_BssResult>,_std::_Select1st<std::pair<const_bdNodeId,_BssResult>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_BssResult>_>_>
          ::find(&(this->mSearchNodes)._M_t,&id->id);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->mSearchNodes)._M_t._M_impl.super__Rb_tree_header)
  {
    std::operator<<((ostream *)&std::cerr,"BitDhtHandler::PeerCallback() Unknown NodeId !!! ");
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    goto switchD_001119cb_default;
  }
  *(uint32_t *)((long)&iVar4._M_node[2]._M_right + 4) = status;
  switch(status) {
  case 1:
    pcVar5 = "BitDhtHandler::PeerCallback() QUERY FAILURE ... do nothin ";
    break;
  case 2:
    pcVar5 = "BitDhtHandler::PeerCallback() QUERY PEER OFFLINE ... do nothin ";
    break;
  case 3:
    pcVar5 = "BitDhtHandler::PeerCallback() QUERY PEER UNREACHABLE ... saving address ";
    goto LAB_00111a07;
  case 4:
    pcVar5 = "BitDhtHandler::PeerCallback() QUERY PEER ONLINE ... saving address";
LAB_00111a07:
    std::operator<<((ostream *)&std::cerr,pcVar5);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    *(undefined4 *)((long)&iVar4._M_node[2]._M_left + 4) = *(undefined4 *)((id->id).data + 0x10);
    uVar1 = *(undefined8 *)&id->addr;
    uVar2 = *(undefined8 *)(id->addr).sin_zero;
    uVar3 = *(undefined8 *)((id->id).data + 8);
    *(undefined8 *)&iVar4._M_node[2].field_0x4 = *(undefined8 *)(id->id).data;
    *(undefined8 *)((long)&iVar4._M_node[2]._M_parent + 4) = uVar3;
    *(undefined8 *)((long)&iVar4._M_node[1]._M_left + 4) = uVar1;
    *(undefined8 *)((long)&iVar4._M_node[1]._M_right + 4) = uVar2;
  default:
    goto switchD_001119cb_default;
  }
  std::operator<<((ostream *)&std::cerr,pcVar5);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
switchD_001119cb_default:
  pthread_mutex_unlock((pthread_mutex_t *)&this->resultsMtx);
  return 1;
}

Assistant:

int BitDhtHandler::PeerCallback(const bdId *id, uint32_t status) {
	std::cerr << "BitDhtHandler::PeerCallback() NodeId: ";
	bdStdPrintId(std::cerr, id);
	std::cerr << std::endl;

    bdStackMutex stack(resultsMtx); /********** MUTEX LOCKED *************/

	/* find the node from our list */
	std::map<bdNodeId, BssResult>::iterator it;
	it = mSearchNodes.find(id->id);
	if (it == mSearchNodes.end()) {
		std::cerr << "BitDhtHandler::PeerCallback() Unknown NodeId !!! ";
		std::cerr << std::endl;
		return 1;
	}
	it->second.status = status;

	bool connect = false;
	switch(status) {
        case BITDHT_MGR_QUERY_FAILURE:
            /* do nothing */
            std::cerr << "BitDhtHandler::PeerCallback() QUERY FAILURE ... do nothin ";
            std::cerr << std::endl;
        break;

        case BITDHT_MGR_QUERY_PEER_OFFLINE:
            /* do nothing */
            std::cerr << "BitDhtHandler::PeerCallback() QUERY PEER OFFLINE ... do nothin ";
            std::cerr << std::endl;
        break;

        case BITDHT_MGR_QUERY_PEER_UNREACHABLE: {
            /* do nothing */
            std::cerr << "BitDhtHandler::PeerCallback() QUERY PEER UNREACHABLE ... saving address ";
            std::cerr << std::endl;

            it->second.id = *id;
            break;
        }
        case BITDHT_MGR_QUERY_PEER_ONLINE: {
            /* do something */

            std::cerr << "BitDhtHandler::PeerCallback() QUERY PEER ONLINE ... saving address";
            std::cerr << std::endl;

            it->second.id = *id;
            break;
        }
	}
	return 1;
}